

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O3

bool __thiscall catalog::createIndex(catalog *this,IndexInfo *indexinfo)

{
  int iVar1;
  pointer ppTVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  _Base_ptr p_Var5;
  iterator iVar6;
  TableInfo *pTVar7;
  _Rb_tree_color _Var8;
  _Base_ptr p_Var9;
  char *pcVar10;
  _Base_ptr p_Var11;
  long lVar12;
  ostream *poVar13;
  _Self __tmp;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  int local_74;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar1 = this->tableNumber;
  if ((long)iVar1 < 1) {
LAB_0011d2c7:
    pcVar10 = "can not find table in list";
    lVar12 = 0x1a;
    poVar13 = (ostream *)&std::cout;
  }
  else {
    ppTVar2 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_74 = -1;
    lVar12 = 0;
    do {
      pTVar7 = ppTVar2[lVar12];
      p_Var5 = *(_Base_ptr *)((long)&(pTVar7->indexInfo)._M_t._M_impl + 0x18);
      p_Var9 = (_Base_ptr)((long)&(pTVar7->indexInfo)._M_t._M_impl + 8);
      if (p_Var5 != p_Var9) {
        p_Var11 = (_Base_ptr)(indexinfo->indexName)._M_string_length;
        do {
          if ((p_Var11 == p_Var5[1]._M_left) &&
             ((p_Var11 == (_Base_ptr)0x0 ||
              (iVar4 = bcmp((indexinfo->indexName)._M_dataplus._M_p,p_Var5[1]._M_parent,
                            (size_t)p_Var11), iVar4 == 0)))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"index ",6);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(indexinfo->indexName)._M_dataplus._M_p,
                                 (indexinfo->indexName)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13," already exists in ",0x13);
            pTVar7 = (this->TableInfoList).
                     super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12];
            goto LAB_0011d2b0;
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != p_Var9);
      }
      __n = (pTVar7->tableName)._M_string_length;
      if ((__n == (indexinfo->tableName)._M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pTVar7->tableName)._M_dataplus._M_p,(indexinfo->tableName)._M_dataplus._M_p
                        ,__n), iVar4 == 0)))) {
        local_74 = (int)lVar12;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar1);
    if (local_74 == -1) goto LAB_0011d2c7;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"i find table in list",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    lVar12 = (long)local_74;
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&((this->TableInfoList).
                     super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12]->getID)._M_t,&indexinfo->colunmName);
    pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar12];
    if (iVar6._M_node != (_Base_ptr)((long)&(pTVar7->getID)._M_t._M_impl + 8U)) {
      p_Var9 = *(_Base_ptr *)((long)&(pTVar7->indexInfo)._M_t._M_impl + 0x10);
      if (p_Var9 == (_Base_ptr)0x0) {
        _Var8 = iVar6._M_node[2]._M_color;
LAB_0011d35c:
        *(undefined4 *)
         (*(long *)&(pTVar7->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data + (long)(int)_Var8 * 4) = 4;
        local_58._0_4_ = iVar6._M_node[2]._M_color;
        pcVar3 = (indexinfo->indexName)._M_dataplus._M_p;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar3,pcVar3 + (indexinfo->indexName)._M_string_length);
        std::
        _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<int,std::__cxx11::string>&>
                  ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                    *)&(this->TableInfoList).
                       super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12]->indexInfo,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_58);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"create index ",0xd);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(indexinfo->indexName)._M_dataplus._M_p,
                             (indexinfo->indexName)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if (this->anychangeornot == false) {
          this->anychangeornot = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        return true;
      }
      p_Var5 = (_Base_ptr)((long)&(pTVar7->indexInfo)._M_t._M_impl + 8);
      _Var8 = iVar6._M_node[2]._M_color;
      p_Var11 = p_Var5;
      do {
        if ((int)_Var8 <= (int)p_Var9[1]._M_color) {
          p_Var11 = p_Var9;
        }
        p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < (int)_Var8];
      } while (p_Var9 != (_Base_ptr)0x0);
      if ((p_Var11 == p_Var5) || ((int)_Var8 < (int)p_Var11[1]._M_color)) goto LAB_0011d35c;
      poVar13 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"index already exists in ",0x18);
      pTVar7 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar12];
LAB_0011d2b0:
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,(pTVar7->tableName)._M_dataplus._M_p,
                           (pTVar7->tableName)._M_string_length);
      lVar12 = *(long *)poVar13;
      goto LAB_0011d2e5;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"can not find colunm ",0x14);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(indexinfo->colunmName)._M_dataplus._M_p,
                         (indexinfo->colunmName)._M_string_length);
    pcVar10 = " in list";
    lVar12 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar10,lVar12);
  lVar12 = *(long *)poVar13;
LAB_0011d2e5:
  std::ios::widen((char)*(undefined8 *)(lVar12 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  return false;
}

Assistant:

bool catalog::createIndex(IndexInfo *indexinfo){
    int pos = -1;
    for(int i = 0 ; i < tableNumber ; i ++){
        std::map<int,std::string>::iterator it;
        it = TableInfoList[i]->indexInfo.begin();
        while(it != TableInfoList[i]->indexInfo.end())
        {
            //检查每个表上indexName是否被占用
            // std::cout << it->second <<std::endl;
            // if(indexinfo->indexID == TableInfoList[])
            if(indexinfo->indexName == it->second){
                 std::cout<<"index "<<indexinfo->indexName <<" already exists in "<<TableInfoList[i]->tableName<<std::endl;
                 return false;
            }
            it ++;         
        }
        //
        if(TableInfoList[i]->tableName == indexinfo->tableName){
            pos = i;
        }
    }

    //
    if(pos == -1){
        std::cout<<"can not find table in list"<<std::endl;
        return false;
    }
    std::cout<<"i find table in list"<<std::endl;
    auto it = TableInfoList[pos]->getID.find(indexinfo->colunmName);
    if(it!=TableInfoList[pos]->getID.end()){
        //这个列名存在
        auto x = TableInfoList[pos]->indexInfo.find(it->second);
        if(x!=TableInfoList[pos]->indexInfo.end()){
            //这个列已经被建立索引
            std::cout<<"index already exists in "<<TableInfoList[pos]->tableName<<std::endl;
            return false;
        }

    }else{
        std::cout<<"can not find colunm "<<indexinfo->colunmName <<" in list"<<std::endl;
        return false;
    }
    //先修改constraint
    TableInfoList[pos]->constraint[it->second] = 4;
    //修改indexInfo
    std::pair<int,std::string> p = std::make_pair(it->second, indexinfo->indexName);      
    TableInfoList[pos]->indexInfo.insert(p);
    std::cout<<"create index "<<indexinfo->indexName<<std::endl;
    if(!anychangeornot)anychangeornot = true;
    return true;
}